

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorisedJoin.cpp
# Opt level: O1

Union * __thiscall
FactorisedJoin::leapfroggingJoin
          (FactorisedJoin *this,DTreeNode *node,int *lower,int *upper,uint partition)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  pointer piVar5;
  int *left;
  int *upper_00;
  PartitionAttributes *pPVar6;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *pvVar7;
  pointer ppVar8;
  Database pTVar9;
  DTreeNode *node_00;
  iterator iVar10;
  iterator __position;
  long lVar11;
  bool bVar12;
  int iVar13;
  iterator iVar14;
  Union *pUVar15;
  double *pdVar16;
  Union **ppUVar17;
  undefined8 uVar18;
  long lVar19;
  vector<node::Union*,std::allocator<node::Union*>> *pvVar20;
  ulong uVar21;
  int i;
  ulong uVar22;
  DTreeNode *pDVar23;
  long lVar24;
  pointer pdVar25;
  long lVar26;
  uint uVar27;
  FactorisedJoin *pFVar28;
  pthread_mutex_t *__mutex;
  DTreeNode **ppDVar29;
  ulong __n;
  int rel;
  allocator_type local_e9;
  DTreeNode *local_e8;
  double val;
  vector<double,std::allocator<double>> *local_d8;
  long local_d0;
  ulong local_c8;
  long local_c0;
  vector<node::Union*,std::allocator<node::Union*>> *local_b8;
  FactorisedJoin *local_b0;
  Union **local_a8;
  uint local_9c;
  vector<double,_std::allocator<double>_> *local_98;
  double *local_90;
  int *local_88;
  vector<double,_std::allocator<double>_> keyVals;
  int *l;
  DTreeNode **local_58;
  ulong local_50;
  vector<double,_std::allocator<double>_> keyVals_1;
  
  local_d0 = (long)node->_id;
  bVar2 = node->_caching;
  uVar22 = (ulong)partition;
  __mutex = (pthread_mutex_t *)(uVar22 * 0x40);
  pdVar16 = this->_partitionFields[uVar22].varMap;
  uVar3 = node->_numOfChildren;
  uVar21 = (ulong)uVar3;
  local_e8 = node;
  local_b0 = this;
  local_9c = partition;
  if (bVar2 == true) {
    keyVals_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(double)node->_id;
    std::vector<double,_std::allocator<double>_>::vector
              (&keyVals,((long)(node->_key).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)(node->_key).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start >> 2) + 1,
               (value_type_conflict3 *)&keyVals_1,(allocator_type *)&l);
    piVar5 = (node->_key).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar19 = (long)(node->_key).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar5;
    if (lVar19 != 0) {
      lVar19 = lVar19 >> 2;
      lVar24 = 0;
      do {
        keyVals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar24] = pdVar16[piVar5[lVar24]];
        lVar24 = lVar24 + 1;
      } while (lVar19 + (ulong)(lVar19 == 0) != lVar24);
    }
    local_a8 = (Union **)lower;
    iVar13 = pthread_mutex_lock((pthread_mutex_t *)&this->_cacheMutex);
    if (iVar13 != 0) {
      iVar13 = std::__throw_system_error(iVar13);
      goto LAB_0012067a;
    }
    iVar14 = std::
             _Hashtable<std::vector<double,_std::allocator<double>_>,_std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>,_std::allocator<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<double,_std::allocator<double>_>_>,_std::hash<std::vector<double,_std::allocator<double>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->_caches)._M_h,&keyVals);
    if (iVar14.
        super__Node_iterator_base<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>,_true>
        ._M_cur != (__node_type *)0x0) {
      node = *(DTreeNode **)
              ((long)iVar14.
                     super__Node_iterator_base<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>,_true>
                     ._M_cur + 0x20);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->_cacheMutex);
    if (keyVals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(keyVals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    lower = (int *)local_a8;
    if (iVar14.
        super__Node_iterator_base<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>,_true>
        ._M_cur != (__node_type *)0x0) {
      return (Union *)node;
    }
  }
  pFVar28 = local_b0;
  left = local_b0->_partitionFields[uVar22].LOWERBOUND[local_d0];
  local_90 = pdVar16;
  l = left;
  memcpy(left,lower,dfdb::params::NUM_OF_TABLES << 2);
  upper_00 = pFVar28->_partitionFields[uVar22].UPPERBOUND[local_d0];
  memcpy(upper_00,upper,dfdb::params::NUM_OF_TABLES << 2);
  pDVar23 = local_e8;
  pPVar6 = pFVar28->_partitionFields;
  local_c0 = local_d0 * 3;
  local_d8 = (vector<double,std::allocator<double>> *)(pPVar6[uVar22].values + local_d0);
  if (*(long *)(local_d8 + 8) != *(long *)local_d8) {
    *(long *)(local_d8 + 8) = *(long *)local_d8;
  }
  local_98 = pPVar6[uVar22].localCount + local_d0;
  pdVar25 = (local_98->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((local_98->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish != pdVar25) {
    (local_98->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pdVar25;
  }
  local_b8 = (vector<node::Union*,std::allocator<node::Union*>> *)
             (pPVar6[uVar22].pointers + local_d0);
  if (*(long *)(local_b8 + 8) != *(long *)local_b8) {
    *(long *)(local_b8 + 8) = *(long *)local_b8;
  }
  local_a8 = pPVar6[uVar22].localPointerPlaceholder[local_d0];
  local_88 = pPVar6[uVar22].ordering[local_d0];
  getRelationOrdering(pFVar28,left,local_e8,local_88);
  rel = 0;
  local_50 = (ulong)((long)(&(pFVar28->_ids->
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish)[local_c0] -
                    (long)(&(pFVar28->_ids->
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)[local_c0]) >> 3;
  local_58 = &pDVar23->_firstChild;
  local_c8 = 0;
  while (bVar12 = seekValue(pFVar28,pDVar23,&rel,local_88,(int)local_50,&l,upper,&val), !bVar12) {
    pvVar7 = pFVar28->_ids;
    lVar19 = (long)(&(pvVar7->
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)
                     ._M_impl.super__Vector_impl_data._M_finish)[local_c0] -
             (long)(&(pvVar7->
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)
                     ._M_impl.super__Vector_impl_data._M_start)[local_c0];
    if (lVar19 != 0) {
      lVar19 = lVar19 >> 3;
      lVar24 = 0;
      do {
        ppVar8 = pvVar7[pDVar23->_id].
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        iVar13 = ppVar8[lVar24].first;
        iVar4 = ppVar8[lVar24].second;
        lVar26 = (long)left[iVar13];
        pTVar9 = pFVar28->_data;
        while (upper_00[iVar13] = (int)lVar26, lVar26 < upper[iVar13]) {
          lVar11 = lVar26 + 1;
          lVar26 = lVar26 + 1;
          dVar1 = pTVar9[iVar13].super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar11][iVar4];
          if ((dVar1 != val) || (NAN(dVar1) || NAN(val))) break;
        }
        lVar24 = lVar24 + 1;
      } while (lVar24 != lVar19 + (ulong)(lVar19 == 0));
    }
    if ((int)uVar3 < 1) {
      iVar10._M_current = *(double **)(local_d8 + 8);
      if (iVar10._M_current == *(double **)(local_d8 + 0x10)) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_d8,iVar10,&val);
      }
      else {
        *iVar10._M_current = val;
        *(double **)(local_d8 + 8) = iVar10._M_current + 1;
      }
      local_c8 = (ulong)((int)local_c8 + 1);
    }
    else {
      local_90[local_d0] = val;
      uVar22 = 0;
      ppDVar29 = local_58;
      do {
        node_00 = *ppDVar29;
        pUVar15 = leapfroggingJoin(pFVar28,node_00,left,upper_00,local_9c);
        local_a8[uVar22] = pUVar15;
        pDVar23 = local_e8;
        if (pUVar15 == (Union *)0x0) goto LAB_00120391;
        ppDVar29 = &node_00->_next;
        uVar22 = uVar22 + 1;
      } while (uVar21 != uVar22);
      iVar10._M_current = *(double **)(local_d8 + 8);
      if (iVar10._M_current == *(double **)(local_d8 + 0x10)) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_d8,iVar10,&val);
      }
      else {
        *iVar10._M_current = val;
        *(double **)(local_d8 + 8) = iVar10._M_current + 1;
      }
      uVar27 = 1;
      pvVar20 = local_b8;
      uVar22 = uVar21;
      ppUVar17 = local_a8;
      if (0 < (int)uVar3) {
        do {
          __position._M_current = *(Union ***)(pvVar20 + 8);
          if (__position._M_current == *(Union ***)(pvVar20 + 0x10)) {
            std::vector<node::Union*,std::allocator<node::Union*>>::
            _M_realloc_insert<node::Union*const&>(local_b8,__position,ppUVar17);
            pvVar20 = local_b8;
          }
          else {
            *__position._M_current = *ppUVar17;
            *(long *)(pvVar20 + 8) = *(long *)(pvVar20 + 8) + 8;
          }
          uVar27 = uVar27 * (*ppUVar17)->count;
          uVar22 = uVar22 - 1;
          ppUVar17 = ppUVar17 + 1;
        } while (uVar22 != 0);
      }
      local_c8 = (ulong)((int)local_c8 + uVar27);
      keyVals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(double)uVar27;
      iVar10._M_current =
           (local_98->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (local_98->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (local_98,iVar10,(double *)&keyVals);
        pDVar23 = local_e8;
        pFVar28 = local_b0;
      }
      else {
        *iVar10._M_current =
             (double)keyVals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        (local_98->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar10._M_current + 1;
        pDVar23 = local_e8;
        pFVar28 = local_b0;
      }
    }
LAB_00120391:
    ppVar8 = (&(pFVar28->_ids->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start)[local_c0];
    lVar19 = (long)(&(pFVar28->_ids->
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)
                     ._M_impl.super__Vector_impl_data._M_finish)[local_c0] - (long)ppVar8;
    if (lVar19 != 0) {
      lVar19 = lVar19 >> 3;
      lVar24 = 0;
      do {
        left[ppVar8[lVar24].first] = upper_00[ppVar8[lVar24].first];
        lVar24 = lVar24 + 1;
      } while (lVar19 + (ulong)(lVar19 == 0) != lVar24);
    }
    iVar13 = ppVar8[local_88[rel]].first;
    iVar4 = left[iVar13];
    left[iVar13] = iVar4 + 1;
    if ((upper[iVar13] <= iVar4) || (rel = (rel + 1) % (int)local_50, bVar12)) break;
  }
  lVar19 = *(long *)(local_d8 + 8);
  lVar24 = *(long *)local_d8;
  iVar13 = (int)((ulong)(lVar19 - lVar24) >> 3);
  if (iVar13 == 0) {
    pUVar15 = (Union *)0x0;
  }
  else {
    pUVar15 = (Union *)operator_new(0x38);
    pUVar15->numberOfValues = 0;
    *(undefined8 *)&pUVar15->cacheIndex = 0;
    pUVar15->values = (double *)0x0;
    pUVar15->children = (Union **)0x0;
    *(undefined8 *)&pUVar15->multiplicity = 0;
    pUVar15->sums = (double *)0x0;
    pUVar15->sumIndexes = (int *)0x0;
    uVar22 = (ulong)iVar13;
    pUVar15->numberOfValues = uVar22;
    pFVar28->numberOfValues = pFVar28->numberOfValues + uVar22;
    __n = (lVar19 - lVar24) * 0x20000000 >> 0x1d;
    if (uVar21 == 0) {
      pdVar16 = (double *)operator_new__(-(ulong)(uVar22 >> 0x3d != 0) | __n);
      pUVar15->values = pdVar16;
      pdVar25 = *(pointer *)local_d8;
    }
    else {
      uVar21 = 0xffffffffffffffff;
      if (-1 < iVar13) {
        uVar21 = (long)(iVar13 * 2) << 3;
      }
      pdVar16 = (double *)operator_new__(uVar21);
      pUVar15->values = pdVar16;
      memcpy(pdVar16,*(void **)local_d8,__n);
      pdVar16 = pdVar16 + uVar22;
      pdVar25 = (local_98->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    memcpy(pdVar16,pdVar25,__n);
    uVar21 = 0xffffffffffffffff;
    if (-1 < (int)(uVar3 * iVar13)) {
      uVar21 = (long)(int)(uVar3 * iVar13) * 8;
    }
    ppUVar17 = (Union **)operator_new__(uVar21);
    pdVar16 = local_90;
    pFVar28 = local_b0;
    pDVar23 = local_e8;
    pUVar15->children = ppUVar17;
    lVar19 = *(long *)local_b8;
    if (*(long *)(local_b8 + 8) != lVar19) {
      uVar21 = 0;
      do {
        pUVar15->children[uVar21] = *(Union **)(lVar19 + uVar21 * 8);
        uVar21 = uVar21 + 1;
        lVar19 = *(long *)local_b8;
      } while (uVar21 < (ulong)(*(long *)(local_b8 + 8) - lVar19 >> 3));
    }
    pUVar15->count = (uint)local_c8;
    if (bVar2 != false) {
      keyVals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(double)(int)local_d0;
      std::vector<double,_std::allocator<double>_>::vector
                (&keyVals_1,
                 ((long)(local_e8->_key).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(local_e8->_key).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) + 1,(value_type_conflict3 *)&keyVals,
                 &local_e9);
      piVar5 = (pDVar23->_key).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar19 = (long)(pDVar23->_key).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)piVar5;
      if (lVar19 != 0) {
        lVar19 = lVar19 >> 2;
        lVar24 = 0;
        do {
          keyVals_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar24] = pdVar16[piVar5[lVar24]];
          lVar24 = lVar24 + 1;
        } while (lVar19 + (ulong)(lVar19 == 0) != lVar24);
      }
      __mutex = (pthread_mutex_t *)&pFVar28->_cacheMutex;
      iVar13 = pthread_mutex_lock(__mutex);
      if (iVar13 != 0) {
LAB_0012067a:
        uVar18 = std::__throw_system_error(iVar13);
        if (keyVals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(keyVals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        pthread_mutex_unlock(__mutex);
        if (keyVals_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(keyVals_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(uVar18);
      }
      uVar3 = pFVar28->numberOfCachedValues;
      pUVar15->cacheIndex = (unsigned_short)uVar3;
      pFVar28->numberOfCachedValues = uVar3 + 1;
      std::vector<double,_std::allocator<double>_>::vector(&keyVals,&keyVals_1);
      std::
      _Hashtable<std::vector<double,std::allocator<double>>,std::pair<std::vector<double,std::allocator<double>>const,node::Union*>,std::allocator<std::pair<std::vector<double,std::allocator<double>>const,node::Union*>>,std::__detail::_Select1st,std::equal_to<std::vector<double,std::allocator<double>>>,std::hash<std::vector<double,std::allocator<double>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::vector<double,std::allocator<double>>const,node::Union*>>
                ((_Hashtable<std::vector<double,std::allocator<double>>,std::pair<std::vector<double,std::allocator<double>>const,node::Union*>,std::allocator<std::pair<std::vector<double,std::allocator<double>>const,node::Union*>>,std::__detail::_Select1st,std::equal_to<std::vector<double,std::allocator<double>>>,std::hash<std::vector<double,std::allocator<double>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&pFVar28->_caches);
      if (keyVals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(keyVals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pthread_mutex_unlock(__mutex);
      if (keyVals_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(keyVals_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
  return pUVar15;
}

Assistant:

Union* FactorisedJoin::leapfroggingJoin(
    DTreeNode* node, int* lower, int* upper, unsigned int partition)
{
    int_fast16_t nodeID = node->_id;
    bool caching = node->_caching;
    double* varMap = _partitionFields[partition].varMap;
    int childrenCount = node->_numOfChildren;

    /* If this node allows for caching we check if the aggregate array has been
     * cached already. */
    if (caching)
    {
        /* 
         * We initialise the elements in the vector to nodeID instead of 
         * default-initialising them. The last element will not be overwritten. 
         */
        vector<double> keyVals(node->_key.size() + 1, nodeID);
        for (size_t i = 0; i < node->_key.size(); ++i)
            keyVals[i] = varMap[node->_key[i]];

        lock_guard<mutex> lock(_cacheMutex);
		
        auto it = _caches.find(keyVals);
        if (it != _caches.end())
        {
            return it->second;			// Return pointer to cached union node.
        }
    }

    /* lower range pointer for each relation. */
    int* l = _partitionFields[partition].LOWERBOUND[nodeID];
    memcpy(l, lower, sizeof(int) * NUM_OF_TABLES);

    /* upper range pointer for each relation. */
    int* u = _partitionFields[partition].UPPERBOUND[nodeID];
    memcpy(u, upper, sizeof(int) * NUM_OF_TABLES);

    vector<double>& unionValues = _partitionFields[partition].values[nodeID];
    unionValues.clear();

    vector<double>& unionCounts = _partitionFields[partition].localCount[nodeID];
    unionCounts.clear();

    vector<Union*>& unionPointers = _partitionFields[partition].pointers[nodeID];
    unionPointers.clear();

    Union** localPointers = _partitionFields[partition].localPointerPlaceholder[nodeID];

    int* ordering = _partitionFields[partition].ordering[nodeID];

    /* Provides order of Relations from min -> max. */
    getRelationOrdering(l, node, ordering);

    /* Value that satisfies the join query - set in seekValue. */
    double val;
    unsigned int count = 0; 

    /* Indexes used by the join algorithm. */
    int i, j, rel = 0, numOfRel = _ids[nodeID].size();
    bool atEnd = false;
    while (!atEnd)
    {
        /* seek the value that satisfies the join query */
        atEnd = seekValue(node, rel, ordering, numOfRel, l, upper, val);

        if (atEnd)
            break;

        /* Get range of tuples with value equal to val. */
        for (size_t k = 0; k < _ids[nodeID].size(); ++k)
        {
            i = _ids[node->_id][k].first;
            j = _ids[node->_id][k].second;
            u[i] = l[i];

            // TODO: This could be optimized and perhaps added to seek value
            while (u[i] < upper[i] && _data[i][u[i] + 1][j] == val)
            {
                ++u[i];
            }
        }

        /*
         * Below the aggregates are updated based on the value that
         * satisfied the join query.
         */
        if (childrenCount > 0)
        {
            bool childEmpty = false;

            /* 
             * Update the varMap which keeps track of the values that satisfy the 
             * join query above this node 
             */
            varMap[nodeID] = val;

            DTreeNode* child = node->_firstChild;
            for (int i = 0; i < childrenCount; ++i)
            {
                /* Call join algorithm for each child */
                localPointers[i] = leapfroggingJoin(child, l, u, partition);

                /*
                 * If the first aggregate for child is zero then count = 0
                 * and the join query is not satisfied for this value. 
                 */ 
                if (localPointers[i] == nullptr)
                {
                    childEmpty = true;
                    break;
                }

                child = child->_next;
            }

            /* if no child is empty we update the aggregates */
            if (!childEmpty)
            {
                /* Push back the value from this node */ 
                unionValues.push_back(val);

                unsigned int localCount = 1;
                for (int i = 0; i < childrenCount; ++i)
                {
                    unionPointers.push_back(localPointers[i]);
                    localCount *= localPointers[i] -> count; 
                }

                count += localCount;
                unionCounts.push_back(localCount);
            }
        }
        /* Case for leaf nodes */
        else
        {
            /* Push back the value from this node */ 
            unionValues.push_back(val);
            ++count;
        }

        for (size_t k = 0; k < _ids[nodeID].size(); ++k)
        {
            i = _ids[nodeID][k].first;
            l[i] = u[i];
        }

        i = _ids[nodeID][ordering[rel]].first;
        l[i] += 1;

        if (l[i] > upper[i])
        {
            atEnd = true;
            break;
        }
        else
        {
            rel = (rel + 1) % numOfRel;
        }
    }

    int numOfUnionValues = unionValues.size(); 
    /*
     * If unionValues.size() == 0 it means that no value for this node
     * has satisfied the join query, so the union is empty.
     */
    if (numOfUnionValues == 0) 
    {
        // delete unionNode; 
        return nullptr;
    }

    /* If there are values in the union we construct the union */
    Union* unionNode = new Union();
    unionNode->numberOfValues = numOfUnionValues;

    numberOfValues += numOfUnionValues; 

    if (childrenCount == 0)
    {
        /* Initialise values array */
        unionNode->values = new double[numOfUnionValues];
		
        /* Copy values into array */
        memcpy(unionNode->values, &unionValues[0],
               numOfUnionValues*sizeof(double));
    }
    else
    {
        /* Initialise values array */
        unionNode->values = new double[numOfUnionValues * 2];
		
        /* Copy values into array */
        memcpy(unionNode->values, &unionValues[0],
               numOfUnionValues*sizeof(double));

        /* Copy values into array */
        memcpy(unionNode->values+numOfUnionValues, &unionCounts[0],
               numOfUnionValues*sizeof(double));
    }

    assert( (size_t) numOfUnionValues * childrenCount == unionPointers.size());

    /* Initialise pointer array */
    unionNode->children = new Union*[numOfUnionValues * childrenCount];

    /* Copy pointer into array */
    for (size_t pointer = 0; pointer < unionPointers.size(); ++pointer)
        unionNode->children[pointer] = unionPointers[pointer];

    unionNode -> count = count; 
	
    /* If we get here and caching is allowed it means that we need to add
     * aggregates to cache. */
    if (caching)
    {
        /*
         * We initialise the elements in the vector to nodeID instead of
         * default-initialising them.  The last element will not be overwritten.
         */
        vector<double> keyVals(node->_key.size() + 1, nodeID);
        for (size_t i = 0; i < node->_key.size(); ++i)
            keyVals[i] = varMap[node->_key[i]];

        /* Lock the _caches map so we can savely insert our newly cached values */
        lock_guard<mutex> lock(_cacheMutex);
        unionNode->cacheIndex = numberOfCachedValues;
        ++numberOfCachedValues;
        _caches.insert({ keyVals, unionNode });
    }

    return unionNode; 
}